

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::drawScaleHandles(XFormWidget *this)

{
  const_reference pvVar1;
  const_reference pvVar2;
  long in_RDI;
  Vector3D q111;
  Vector3D q110;
  Vector3D q101;
  Vector3D q100;
  Vector3D q011;
  Vector3D q010;
  Vector3D q001;
  Vector3D q000;
  Vector3D q;
  int i_1;
  Vector3D b;
  int i;
  double r;
  Vector3D c;
  double boxSize;
  Vector3D *in_stack_fffffffffffffb68;
  const_reference in_stack_fffffffffffffb70;
  const_reference in_stack_fffffffffffffb78;
  undefined1 local_400 [96];
  double local_3a0;
  undefined1 local_380 [96];
  double local_320;
  undefined1 local_300 [96];
  double local_2a0;
  XFormWidget *in_stack_fffffffffffffd70;
  undefined1 local_280 [72];
  double local_238;
  undefined1 local_218 [72];
  double local_1d0;
  undefined1 local_1b0 [72];
  double local_168;
  undefined1 local_148 [72];
  double local_100;
  undefined1 local_e0 [24];
  double local_c8;
  int local_8c;
  double local_88;
  undefined1 local_68 [28];
  int local_4c;
  double local_30;
  Vector3D local_28;
  undefined8 local_10;
  
  local_10 = 0x3fc999999999999a;
  if (*(long *)(in_RDI + 0xf0) != 0) {
    Vector3D::Vector3D(&local_28,(Vector3D *)(in_RDI + 0x1b8));
    Vector3D::operator-(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    local_30 = Vector3D::norm((Vector3D *)0x215629);
    local_30 = local_30 / 2.0;
    glLineWidth(0x41000000);
    glBegin(1);
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      local_88 = local_30 * 0.9;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),
                 (long)local_4c);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      pvVar1 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)(in_RDI + 0x200),(long)local_4c);
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar1,0);
      glColor4ubv(pvVar2);
      glVertex3dv(&local_28);
      glVertex3dv(local_68);
    }
    glEnd();
    glBegin(7);
    for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
      pvVar1 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)(in_RDI + 0x200),(long)local_8c);
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar1,0);
      glColor4ubv(pvVar2);
      local_c8 = local_30 * 0.8;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),
                 (long)local_8c);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_100 = local_30 * 0.5 * 0.2;
      in_stack_fffffffffffffb70 =
           std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                     ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                      (in_RDI + 0x158),0);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),1);
      Vector3D::operator-(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),2);
      Vector3D::operator-(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_168 = local_30 * 0.5 * 0.2;
      in_stack_fffffffffffffb78 =
           std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                     ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                      (in_RDI + 0x158),0);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),1);
      Vector3D::operator-(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),2);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_1d0 = local_30 * 0.5 * 0.2;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),0);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),1);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),2);
      Vector3D::operator-(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_238 = local_30 * 0.5 * 0.2;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),0);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),1);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),2);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_2a0 = local_30 * 0.5 * 0.2;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),0);
      Vector3D::operator-(in_stack_fffffffffffffb68);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),1);
      Vector3D::operator-(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),2);
      Vector3D::operator-(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_320 = local_30 * 0.5 * 0.2;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),0);
      Vector3D::operator-(in_stack_fffffffffffffb68);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),1);
      Vector3D::operator-(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),2);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_3a0 = local_30 * 0.5 * 0.2;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),0);
      Vector3D::operator-(in_stack_fffffffffffffb68);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),1);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),2);
      Vector3D::operator-(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),0);
      Vector3D::operator-(in_stack_fffffffffffffb68);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),1);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)(in_RDI + 0x158),2);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      CMU462::operator*(&in_stack_fffffffffffffb78->x,in_stack_fffffffffffffb70);
      Vector3D::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      glVertex3dv(local_e0);
      glVertex3dv(local_148);
      glVertex3dv(local_218);
      glVertex3dv(local_1b0);
      glVertex3dv(local_280);
      glVertex3dv(local_300);
      glVertex3dv(local_400);
      glVertex3dv(local_380);
      glVertex3dv(local_e0);
      glVertex3dv(local_1b0);
      glVertex3dv(local_380);
      glVertex3dv(local_280);
      glVertex3dv(local_148);
      glVertex3dv(local_218);
      glVertex3dv(local_400);
      glVertex3dv(local_300);
      glVertex3dv(local_e0);
      glVertex3dv(local_280);
      glVertex3dv(local_300);
      glVertex3dv(local_148);
      glVertex3dv(local_1b0);
      glVertex3dv(local_380);
      glVertex3dv(local_400);
      glVertex3dv(local_218);
    }
    glEnd();
    drawCenterHandle(in_stack_fffffffffffffd70);
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawScaleHandles() const {
  const double boxSize = .2;

  if (target.object == nullptr) return;

  Vector3D c = center;
  double r = (bounds.max - bounds.min).norm() / 2.;

  // Draw arrow stems
  glLineWidth(8.);
  glBegin(GL_LINES);
  for (int i = 0; i < 3; i++) {
    Vector3D b = c + (1. - boxSize / 2.) * r * axes[i];

    glColor4ubv(&axisColors[i][0]);

    glVertex3dv(&c.x);
    glVertex3dv(&b.x);
  }
  glEnd();

  // Draw box heads
  glBegin(GL_QUADS);
  for (int i = 0; i < 3; i++) {
    glColor4ubv(&axisColors[i][0]);
    Vector3D q = c + r * (1. - boxSize) * axes[i];
    Vector3D q000 = q + .5 * r * boxSize * (axes[0] - axes[1] - axes[2]);
    Vector3D q001 = q + .5 * r * boxSize * (axes[0] - axes[1] + axes[2]);
    Vector3D q010 = q + .5 * r * boxSize * (axes[0] + axes[1] - axes[2]);
    Vector3D q011 = q + .5 * r * boxSize * (axes[0] + axes[1] + axes[2]);
    Vector3D q100 = q + .5 * r * boxSize * (-axes[0] - axes[1] - axes[2]);
    Vector3D q101 = q + .5 * r * boxSize * (-axes[0] - axes[1] + axes[2]);
    Vector3D q110 = q + .5 * r * boxSize * (-axes[0] + axes[1] - axes[2]);
    Vector3D q111 = q + .5 * r * boxSize * (-axes[0] + axes[1] + axes[2]);

    glVertex3dv(&q000.x);
    glVertex3dv(&q001.x);
    glVertex3dv(&q011.x);
    glVertex3dv(&q010.x);
    glVertex3dv(&q100.x);
    glVertex3dv(&q101.x);
    glVertex3dv(&q111.x);
    glVertex3dv(&q110.x);
    glVertex3dv(&q000.x);
    glVertex3dv(&q010.x);
    glVertex3dv(&q110.x);
    glVertex3dv(&q100.x);
    glVertex3dv(&q001.x);
    glVertex3dv(&q011.x);
    glVertex3dv(&q111.x);
    glVertex3dv(&q101.x);
    glVertex3dv(&q000.x);
    glVertex3dv(&q100.x);
    glVertex3dv(&q101.x);
    glVertex3dv(&q001.x);
    glVertex3dv(&q010.x);
    glVertex3dv(&q110.x);
    glVertex3dv(&q111.x);
    glVertex3dv(&q011.x);
  }
  glEnd();

  drawCenterHandle();

  glLineWidth(1.);
}